

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

HTTPResponse * processPhp(HTTPResponse *__return_storage_ptr__,HTTPRequest *req)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  iterator iVar1;
  mapped_type *pmVar2;
  allocator<char> local_b1;
  string output;
  string headers;
  string local_70;
  string fullPath;
  
  exec_abi_cxx11_(&fullPath,"pwd");
  fullPath._M_dataplus._M_p[fullPath._M_string_length - 1] = '/';
  std::__cxx11::string::append((string *)&fullPath);
  setenv("GATEWAY_INTERFACE","CGI/1.1",1);
  setenv("REDIRECT_STATUS","200",1);
  setenv("REQUEST_METHOD",(req->method)._M_dataplus._M_p,1);
  setenv("SCRIPT_FILENAME",fullPath._M_dataplus._M_p,1);
  setenv("SCRIPT_NAME",(req->filepath)._M_dataplus._M_p,1);
  setenv("QUERY_STRING",(req->query)._M_dataplus._M_p,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"Content-Length",(allocator<char> *)&headers);
  this = &req->headers;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this->_M_t,&output);
  std::__cxx11::string::~string((string *)&output);
  if ((_Rb_tree_header *)iVar1._M_node != &(req->headers)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"Content-Type",(allocator<char> *)&headers);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this,&output);
    setenv("CONTENT_TYPE",(pmVar2->_M_dataplus)._M_p,1);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"Content-Length",(allocator<char> *)&headers);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this,&output);
    setenv("CONTENT_LENGTH",(pmVar2->_M_dataplus)._M_p,1);
    std::__cxx11::string::~string((string *)&output);
  }
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  std::mutex::lock(&phpInputFileMutex);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&headers,"input.txt",(allocator<char> *)&local_70);
  writeFile(&headers,&req->body);
  std::__cxx11::string::~string((string *)&headers);
  exec_abi_cxx11_(&headers,"php-cgi < input.txt");
  std::__cxx11::string::operator=((string *)&output,(string *)&headers);
  std::__cxx11::string::~string((string *)&headers);
  pthread_mutex_unlock((pthread_mutex_t *)&phpInputFileMutex);
  std::__cxx11::string::find((char *)&output,0x107391);
  std::__cxx11::string::substr((ulong)&headers,(ulong)&output);
  std::__cxx11::string::substr((ulong)&local_70,(ulong)&output);
  std::__cxx11::string::operator=((string *)&output,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"OK",&local_b1);
  HTTPResponse::HTTPResponse(__return_storage_ptr__,200,&local_70,&headers,&output,true);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&headers);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&fullPath);
  return __return_storage_ptr__;
}

Assistant:

HTTPResponse processPhp(HTTPRequest& req)
{
    std::string fullPath = exec("pwd");
    fullPath.back() = '/';
    fullPath += req.filepath;

    setenv("GATEWAY_INTERFACE", "CGI/1.1", 1);
    setenv("REDIRECT_STATUS", "200", 1);

    setenv("REQUEST_METHOD", req.method.c_str(), 1);
    setenv("SCRIPT_FILENAME", fullPath.c_str(), 1);
    setenv("SCRIPT_NAME", req.filepath.c_str(), 1);
    setenv("QUERY_STRING", req.query.c_str(), 1);

    if (req.headers.find("Content-Length") != req.headers.end())
    {
        setenv("CONTENT_TYPE", req.headers["Content-Type"].c_str(), 1);
        setenv("CONTENT_LENGTH", req.headers["Content-Length"].c_str(), 1);
    }

    string output;
    {
        lock_guard<mutex> guard(phpInputFileMutex);

        writeFile("input.txt", req.body);

        #ifdef USE_PHP_FPM
        output = exec("cgi-fcgi < input.txt -bind -connect /var/run/php/php-fpm.sock");
        #else
        output = exec("php-cgi < input.txt");
        #endif  
    }

    auto pos = output.find("\n");
    string headers = output.substr(0, pos);
    output = output.substr(pos);

    return HTTPResponse(200, "OK", headers, output, true);
}